

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

void ** ialloc(mstate m,size_t n_elements,size_t *sizes,int opts,void **chunks)

{
  flag_t fVar1;
  int iVar2;
  void *__s;
  void **ppvVar3;
  undefined1 *puVar4;
  undefined4 in_register_0000000c;
  mstate pmVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong local_48;
  
  ppvVar3 = (void **)CONCAT44(in_register_0000000c,opts);
  if (mparams.magic == 0) {
    init_mparams();
  }
  fVar1 = _gm_.mflags;
  if (ppvVar3 == (void **)0x0) {
    if (m == (mstate)0x0) {
      ppvVar3 = (void **)malloc(0);
      return ppvVar3;
    }
    local_48 = 0x20;
    if (0x16 < (ulong)((long)m * 8)) {
      local_48 = (long)m * 8 + 0x17U & 0xfffffffffffffff0;
    }
  }
  else {
    if (m == (mstate)0x0) {
      return ppvVar3;
    }
    local_48 = 0;
  }
  if (((ulong)sizes & 1) == 0) {
    uVar12 = 0;
    pmVar5 = (mstate)0x0;
    uVar8 = 0;
    do {
      uVar7 = *(ulong *)(n_elements + (long)pmVar5 * 8);
      uVar9 = uVar7 + 0x17 & 0xfffffffffffffff0;
      if (uVar7 < 0x17) {
        uVar9 = 0x20;
      }
      uVar8 = uVar8 + uVar9;
      pmVar5 = (mstate)((long)&pmVar5->smallmap + 1);
    } while (m != pmVar5);
  }
  else {
    uVar12 = 0x20;
    if (0x16 < *(ulong *)n_elements) {
      uVar12 = *(ulong *)n_elements + 0x17 & 0xfffffffffffffff0;
    }
    uVar8 = uVar12 * (long)m;
  }
  _gm_.mflags = _gm_.mflags & 0xfffffffe;
  __s = malloc((local_48 + uVar8) - 8);
  iVar2 = _gm_.mutex;
  if ((fVar1 & 1) != 0) {
    _gm_.mflags = _gm_.mflags | 1;
  }
  if (__s == (void *)0x0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    if ((_gm_.mflags & 2) != 0) {
      uVar6 = 1;
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
      if (iVar2 != 0) {
        while (_gm_.mutex != 0) {
          if ((uVar6 & 0x3f) == 0) {
            sched_yield();
          }
          uVar6 = uVar6 + 1;
        }
        LOCK();
        _gm_.mutex = 1;
        UNLOCK();
      }
    }
    uVar7 = *(ulong *)((long)__s + -8) & 0xfffffffffffffff8;
    if (((ulong)sizes & 2) != 0) {
      memset(__s,0,(uVar7 - local_48) - 8);
    }
    lVar10 = (long)__s + -0x10;
    if (ppvVar3 == (void **)0x0) {
      ppvVar3 = (void **)(lVar10 + uVar8 + 0x10);
      *(ulong *)(lVar10 + uVar8 + 8) = uVar7 - uVar8 | 3;
      uVar7 = uVar8;
    }
    *ppvVar3 = __s;
    if (m != (mstate)0x1) {
      puVar4 = (undefined1 *)0x0;
      lVar11 = lVar10;
      do {
        uVar8 = uVar12;
        if ((uVar12 == 0) &&
           (uVar9 = *(ulong *)(n_elements + (long)puVar4 * 8),
           uVar8 = uVar9 + 0x17 & 0xfffffffffffffff0, uVar9 < 0x17)) {
          uVar8 = 0x20;
        }
        uVar7 = uVar7 - uVar8;
        *(ulong *)(lVar11 + 8) = uVar8 | 3;
        lVar10 = lVar11 + uVar8;
        ppvVar3[(long)(puVar4 + 1)] = (void *)(uVar8 + lVar11 + 0x10);
        puVar4 = puVar4 + 1;
        lVar11 = lVar10;
      } while ((undefined1 *)((long)&m[-1].exts + 7) != puVar4);
    }
    *(ulong *)(lVar10 + 8) = uVar7 | 3;
    if ((_gm_.mflags & 2) != 0) {
      _gm_.mutex = 0;
    }
  }
  return ppvVar3;
}

Assistant:

static void** ialloc(mstate m,
                     size_t n_elements,
                     size_t* sizes,
                     int opts,
                     void* chunks[]) {

  size_t    element_size;   /* chunksize of each element, if all same */
  size_t    contents_size;  /* total size of elements */
  size_t    array_size;     /* request size of pointer array */
  void*     mem;            /* malloced aggregate space */
  mchunkptr p;              /* corresponding chunk */
  size_t    remainder_size; /* remaining bytes while splitting */
  void**    marray;         /* either "chunks" or malloced ptr array */
  mchunkptr array_chunk;    /* chunk for malloced ptr array */
  flag_t    was_enabled;    /* to disable mmap */
  size_t    size;
  size_t    i;

  ensure_initialization();
  /* compute array length, if needed */
  if (chunks != 0) {
    if (n_elements == 0)
      return chunks; /* nothing to do */
    marray = chunks;
    array_size = 0;
  }
  else {
    /* if empty req, must still return chunk representing empty array */
    if (n_elements == 0)
      return (void**)internal_malloc(m, 0);
    marray = 0;
    array_size = request2size(n_elements * (sizeof(void*)));
  }

  /* compute total element size */
  if (opts & 0x1) { /* all-same-size */
    element_size = request2size(*sizes);
    contents_size = n_elements * element_size;
  }
  else { /* add up all the sizes */
    element_size = 0;
    contents_size = 0;
    for (i = 0; i != n_elements; ++i)
      contents_size += request2size(sizes[i]);
  }

  size = contents_size + array_size;

  /*
     Allocate the aggregate chunk.  First disable direct-mmapping so
     malloc won't use it, since we would not be able to later
     free/realloc space internal to a segregated mmap region.
  */
  was_enabled = use_mmap(m);
  disable_mmap(m);
  mem = internal_malloc(m, size - CHUNK_OVERHEAD);
  if (was_enabled)
    enable_mmap(m);
  if (mem == 0)
    return 0;

  if (PREACTION(m)) return 0;
  p = mem2chunk(mem);
  remainder_size = chunksize(p);

  assert(!is_mmapped(p));

  if (opts & 0x2) {       /* optionally clear the elements */
    memset((size_t*)mem, 0, remainder_size - SIZE_T_SIZE - array_size);
  }

  /* If not provided, allocate the pointer array as final part of chunk */
  if (marray == 0) {
    size_t  array_chunk_size;
    array_chunk = chunk_plus_offset(p, contents_size);
    array_chunk_size = remainder_size - contents_size;
    marray = (void**) (chunk2mem(array_chunk));
    set_size_and_pinuse_of_inuse_chunk(m, array_chunk, array_chunk_size);
    remainder_size = contents_size;
  }

  /* split out elements */
  for (i = 0; ; ++i) {
    marray[i] = chunk2mem(p);
    if (i != n_elements-1) {
      if (element_size != 0)
        size = element_size;
      else
        size = request2size(sizes[i]);
      remainder_size -= size;
      set_size_and_pinuse_of_inuse_chunk(m, p, size);
      p = chunk_plus_offset(p, size);
    }
    else { /* the final element absorbs any overallocation slop */
      set_size_and_pinuse_of_inuse_chunk(m, p, remainder_size);
      break;
    }
  }

#if DEBUG
  if (marray != chunks) {
    /* final element must have exactly exhausted chunk */
    if (element_size != 0) {
      assert(remainder_size == element_size);
    }
    else {
      assert(remainder_size == request2size(sizes[i]));
    }
    check_inuse_chunk(m, mem2chunk(marray));
  }
  for (i = 0; i != n_elements; ++i)
    check_inuse_chunk(m, mem2chunk(marray[i]));

#endif /* DEBUG */

  POSTACTION(m);
  return marray;
}